

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

void duckdb::IntervalTryAddition<long>
               (long *target,int64_t input,int64_t multiplier,int64_t fraction)

{
  bool bVar1;
  long lVar2;
  OutOfRangeException *pOVar3;
  allocator local_49;
  int64_t addition;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(input,multiplier,&addition);
  if (!bVar1) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_40,"interval value is out of range",&local_49);
    OutOfRangeException::OutOfRangeException(pOVar3,&local_40);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar2 = Cast::Operation<long,long>(addition);
  bVar1 = TryAddOperator::Operation<long,long,long>(*target,lVar2,target);
  if (bVar1) {
    if (fraction != 0) {
      addition = (fraction * multiplier) / 1000000;
      lVar2 = Cast::Operation<long,long>(addition);
      bVar1 = TryAddOperator::Operation<long,long,long>(*target,lVar2,target);
      if (!bVar1) {
        pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,"interval fraction is out of range",&local_49);
        OutOfRangeException::OutOfRangeException(pOVar3,&local_40);
        __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    return;
  }
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"interval value is out of range",&local_49);
  OutOfRangeException::OutOfRangeException(pOVar3,&local_40);
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntervalTryAddition(T &target, int64_t input, int64_t multiplier, int64_t fraction = 0) {
	int64_t addition;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(input, multiplier, addition)) {
		throw OutOfRangeException("interval value is out of range");
	}
	T addition_base = Cast::Operation<int64_t, T>(addition);
	if (!TryAddOperator::Operation<T, T, T>(target, addition_base, target)) {
		throw OutOfRangeException("interval value is out of range");
	}
	if (fraction) {
		//	Add in (fraction * multiplier) / MICROS_PER_SEC
		//	This is always in range
		addition = (fraction * multiplier) / Interval::MICROS_PER_SEC;
		addition_base = Cast::Operation<int64_t, T>(addition);
		if (!TryAddOperator::Operation<T, T, T>(target, addition_base, target)) {
			throw OutOfRangeException("interval fraction is out of range");
		}
	}
}